

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  secp256k1_scalar *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_tweak_add_cold_3();
  }
  else if (seckey != (uchar *)0x0) {
    if (tweak32 == (uchar *)0x0) {
      secp256k1_ec_seckey_tweak_add_cold_1();
      return 0;
    }
    uVar1 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)local_78,seckey);
    uVar2 = secp256k1_ec_seckey_tweak_add_helper((secp256k1_scalar *)local_78,tweak32);
    secp256k1_scalar_verify(&secp256k1_scalar_zero);
    local_58 = 0x4d430005;
    local_48 = 0x20;
    local_40 = 0;
    local_38 = 0;
    local_30 = 0;
    lVar3 = (long)(int)(uVar2 & uVar1 ^ 1) + -1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    local_78 = local_78 & auVar4;
    local_68 = auVar4 & local_68;
    local_50 = (secp256k1_scalar *)local_78;
    secp256k1_scalar_verify((secp256k1_scalar *)local_78);
    secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)local_78);
    return uVar2 & uVar1;
  }
  secp256k1_ec_seckey_tweak_add_cold_2();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= secp256k1_ec_seckey_tweak_add_helper(&sec, tweak32);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}